

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigFwd.hpp
# Opt level: O0

vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> * __thiscall
CLI::Config::from_file
          (vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *__return_storage_ptr__,
          Config *this,string *name)

{
  byte bVar1;
  FileError *__return_storage_ptr___00;
  string local_258;
  undefined1 local_228 [8];
  ifstream input;
  string *name_local;
  Config *this_local;
  
  input._512_8_ = name;
  ::std::ifstream::ifstream(local_228,(string *)name,_S_in);
  bVar1 = ::std::ios::good();
  if ((bVar1 & 1) == 0) {
    __return_storage_ptr___00 = (FileError *)__cxa_allocate_exception(0x38);
    ::std::__cxx11::string::string
              ((string *)&local_258,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)input._512_8_);
    FileError::Missing(__return_storage_ptr___00,&local_258);
    __cxa_throw(__return_storage_ptr___00,&FileError::typeinfo,FileError::~FileError);
  }
  (*this->_vptr_Config[1])(__return_storage_ptr__,this,local_228);
  ::std::ifstream::~ifstream(local_228);
  return __return_storage_ptr__;
}

Assistant:

std::vector<ConfigItem> from_file(const std::string &name) {
        std::ifstream input{name};
        if(!input.good())
            throw FileError::Missing(name);

        return from_config(input);
    }